

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

size_t mbedtls_mpi_bitlen(mbedtls_mpi *X)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  sVar3 = X->n;
  if (X->n == 0) {
    return 0;
  }
  do {
    if (sVar3 == 1) {
      sVar2 = 0;
      break;
    }
    sVar2 = sVar3 - 1;
    lVar4 = sVar3 - 1;
    sVar3 = sVar2;
  } while (X->p[lVar4] == 0);
  lVar4 = 0x41;
  do {
    if (lVar4 == 1) {
      lVar4 = 0;
      break;
    }
    iVar1 = (int)lVar4;
    lVar4 = lVar4 + -1;
  } while ((X->p[sVar2] >> ((ulong)(iVar1 - 2U & 0xff) & 0x3f) & 1) == 0);
  return sVar2 * 0x40 + lVar4;
}

Assistant:

size_t mbedtls_mpi_bitlen( const mbedtls_mpi *X )
{
    size_t i, j;

    if( X->n == 0 )
        return( 0 );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;

    for( j = biL; j > 0; j-- )
        if( ( ( X->p[i] >> ( j - 1 ) ) & 1 ) != 0 )
            break;

    return( ( i * biL ) + j );
}